

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Layout * __thiscall ear::Layout::withoutLfe(Layout *__return_storage_ptr__,Layout *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *__x;
  back_insert_iterator<std::vector<ear::Channel,_std::allocator<ear::Channel>_>_> bVar3;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_138;
  string local_100;
  variant<ear::PolarScreen,_ear::CartesianScreen> local_e0;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_b0;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_78 [2];
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Layout *local_18;
  Layout *this_local;
  Layout *layoutWithoutLfe;
  
  local_19 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  local_78[0].super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78[0].super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0].super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector(local_78);
  getDefaultScreen();
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::optional
            (&local_b0,&local_e0);
  Layout(__return_storage_ptr__,&local_40,local_78,&local_b0);
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::~optional(&local_b0);
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::~variant(&local_e0);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)&local_100,(string *)this);
  name(__return_storage_ptr__,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::optional
            (&local_138,&this->_screen);
  screen(__return_storage_ptr__,&local_138);
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::~optional(&local_138);
  cVar1 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  cVar2 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  __x = channels(__return_storage_ptr__);
  bVar3 = std::back_inserter<std::vector<ear::Channel,std::allocator<ear::Channel>>>(__x);
  std::
  copy_if<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,std::back_insert_iterator<std::vector<ear::Channel,std::allocator<ear::Channel>>>,ear::Layout::withoutLfe()const::__0>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

Layout Layout::withoutLfe() const {
    Layout layoutWithoutLfe;
    layoutWithoutLfe.name(_name);
    layoutWithoutLfe.screen(_screen);
    std::copy_if(_channels.begin(), _channels.end(),
                 back_inserter(layoutWithoutLfe.channels()),
                 [](const Channel& c) { return !c.isLfe(); });
    return layoutWithoutLfe;
  }